

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O3

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  UInt16 *pUVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ELzmaDummy EVar7;
  int iVar8;
  ulong uVar9;
  Byte *pBVar10;
  SizeT inSize;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  int iVar38;
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar42 [16];
  long lVar17;
  
  inSize = *srcLen;
  *srcLen = 0;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (p->remainLen != 0x112) {
    buf = p->tempBuf;
    do {
      auVar5 = _DAT_001a2020;
      if (p->needFlush != 0) {
        for (; inSize != 0; inSize = inSize - 1) {
          uVar6 = p->tempBufSize;
          if (4 < (ulong)uVar6) goto LAB_00195d03;
          BVar1 = *src;
          src = src + 1;
          p->tempBufSize = uVar6 + 1;
          p->tempBuf[uVar6] = BVar1;
          *srcLen = *srcLen + 1;
        }
        if (p->tempBufSize < 5) goto LAB_001961d9;
        inSize = 0;
LAB_00195d03:
        if (*buf != '\0') {
          return 1;
        }
        uVar6 = *(uint *)(p->tempBuf + 1);
        p->code = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
      }
      uVar11 = p->dicPos;
      if (dicLimit <= uVar11) {
        if (p->remainLen != 0) {
          if (finishMode == LZMA_FINISH_ANY) {
LAB_0019619d:
            *status = LZMA_STATUS_NOT_FINISHED;
            return 0;
          }
          goto LAB_0019618b;
        }
        if (p->code == 0) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
          return 0;
        }
        if (finishMode == LZMA_FINISH_ANY) goto LAB_0019619d;
      }
      if (p->needInitState != 0) {
        uVar6 = 0x300 << ((char)(p->prop).lp + (char)(p->prop).lc & 0x1fU);
        pUVar2 = p->probs;
        lVar17 = (ulong)uVar6 + 0x735;
        auVar14._8_4_ = (int)lVar17;
        auVar14._0_8_ = lVar17;
        auVar14._12_4_ = (int)((ulong)lVar17 >> 0x20);
        auVar14 = auVar14 ^ auVar5;
        uVar9 = 0;
        auVar16 = _DAT_001a2010;
        auVar18 = _DAT_001a2000;
        auVar19 = _DAT_001a1ff0;
        auVar20 = _DAT_001a1fe0;
        do {
          auVar21 = auVar16 ^ auVar5;
          iVar35 = auVar14._0_4_;
          iVar34 = -(uint)(iVar35 < auVar21._0_4_);
          iVar8 = auVar14._4_4_;
          auVar22._4_4_ = -(uint)(iVar8 < auVar21._4_4_);
          iVar39 = auVar14._8_4_;
          iVar38 = -(uint)(iVar39 < auVar21._8_4_);
          iVar15 = auVar14._12_4_;
          auVar22._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
          auVar31._4_4_ = iVar34;
          auVar31._0_4_ = iVar34;
          auVar31._8_4_ = iVar38;
          auVar31._12_4_ = iVar38;
          auVar40 = pshuflw(in_XMM8,auVar31,0xe8);
          auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar8);
          auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
          auVar24._0_4_ = auVar24._4_4_;
          auVar24._8_4_ = auVar24._12_4_;
          auVar42 = pshuflw(in_XMM9,auVar24,0xe8);
          auVar22._0_4_ = auVar22._4_4_;
          auVar22._8_4_ = auVar22._12_4_;
          auVar41 = pshuflw(auVar40,auVar22,0xe8);
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          auVar21 = (auVar41 | auVar42 & auVar40) ^ auVar21;
          auVar21 = packssdw(auVar21,auVar21);
          if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar2[uVar9] = 0x400;
          }
          auVar22 = auVar24 & auVar31 | auVar22;
          auVar21 = packssdw(auVar22,auVar22);
          auVar41._8_4_ = 0xffffffff;
          auVar41._0_8_ = 0xffffffffffffffff;
          auVar41._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
          if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
            pUVar2[uVar9 + 1] = 0x400;
          }
          auVar21 = auVar18 ^ auVar5;
          iVar34 = -(uint)(iVar35 < auVar21._0_4_);
          auVar36._4_4_ = -(uint)(iVar8 < auVar21._4_4_);
          iVar38 = -(uint)(iVar39 < auVar21._8_4_);
          auVar36._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
          auVar23._4_4_ = iVar34;
          auVar23._0_4_ = iVar34;
          auVar23._8_4_ = iVar38;
          auVar23._12_4_ = iVar38;
          auVar30._4_4_ = -(uint)(auVar21._4_4_ == iVar8);
          auVar30._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
          auVar30._0_4_ = auVar30._4_4_;
          auVar30._8_4_ = auVar30._12_4_;
          auVar36._0_4_ = auVar36._4_4_;
          auVar36._8_4_ = auVar36._12_4_;
          auVar21 = auVar30 & auVar23 | auVar36;
          auVar21 = packssdw(auVar21,auVar21);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
          if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar2[uVar9 + 2] = 0x400;
          }
          auVar24 = pshufhw(auVar23,auVar23,0x84);
          auVar31 = pshufhw(auVar30,auVar30,0x84);
          auVar22 = pshufhw(auVar24,auVar36,0x84);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar25 = (auVar22 | auVar31 & auVar24) ^ auVar25;
          auVar24 = packssdw(auVar25,auVar25);
          if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar2[uVar9 + 3] = 0x400;
          }
          auVar24 = auVar19 ^ auVar5;
          iVar34 = -(uint)(iVar35 < auVar24._0_4_);
          auVar27._4_4_ = -(uint)(iVar8 < auVar24._4_4_);
          iVar38 = -(uint)(iVar39 < auVar24._8_4_);
          auVar27._12_4_ = -(uint)(iVar15 < auVar24._12_4_);
          auVar32._4_4_ = iVar34;
          auVar32._0_4_ = iVar34;
          auVar32._8_4_ = iVar38;
          auVar32._12_4_ = iVar38;
          auVar21 = pshuflw(auVar21,auVar32,0xe8);
          auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar8);
          auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar15);
          auVar26._0_4_ = auVar26._4_4_;
          auVar26._8_4_ = auVar26._12_4_;
          in_XMM9 = pshuflw(auVar42 & auVar40,auVar26,0xe8);
          in_XMM9 = in_XMM9 & auVar21;
          auVar27._0_4_ = auVar27._4_4_;
          auVar27._8_4_ = auVar27._12_4_;
          auVar21 = pshuflw(auVar21,auVar27,0xe8);
          auVar40._8_4_ = 0xffffffff;
          auVar40._0_8_ = 0xffffffffffffffff;
          auVar40._12_4_ = 0xffffffff;
          auVar40 = (auVar21 | in_XMM9) ^ auVar40;
          auVar21 = packssdw(auVar40,auVar40);
          if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            pUVar2[uVar9 + 4] = 0x400;
          }
          auVar27 = auVar26 & auVar32 | auVar27;
          auVar21 = packssdw(auVar27,auVar27);
          auVar42._8_4_ = 0xffffffff;
          auVar42._0_8_ = 0xffffffffffffffff;
          auVar42._12_4_ = 0xffffffff;
          auVar21 = packssdw(auVar21 ^ auVar42,auVar21 ^ auVar42);
          if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            pUVar2[uVar9 + 5] = 0x400;
          }
          auVar21 = auVar20 ^ auVar5;
          iVar35 = -(uint)(iVar35 < auVar21._0_4_);
          auVar37._4_4_ = -(uint)(iVar8 < auVar21._4_4_);
          iVar39 = -(uint)(iVar39 < auVar21._8_4_);
          auVar37._12_4_ = -(uint)(iVar15 < auVar21._12_4_);
          auVar28._4_4_ = iVar35;
          auVar28._0_4_ = iVar35;
          auVar28._8_4_ = iVar39;
          auVar28._12_4_ = iVar39;
          auVar33._4_4_ = -(uint)(auVar21._4_4_ == iVar8);
          auVar33._12_4_ = -(uint)(auVar21._12_4_ == iVar15);
          auVar33._0_4_ = auVar33._4_4_;
          auVar33._8_4_ = auVar33._12_4_;
          auVar37._0_4_ = auVar37._4_4_;
          auVar37._8_4_ = auVar37._12_4_;
          auVar21 = auVar33 & auVar28 | auVar37;
          auVar21 = packssdw(auVar21,auVar21);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            pUVar2[uVar9 + 6] = 0x400;
          }
          auVar21 = pshufhw(auVar28,auVar28,0x84);
          auVar22 = pshufhw(auVar33,auVar33,0x84);
          auVar24 = pshufhw(auVar21,auVar37,0x84);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar29 = (auVar24 | auVar22 & auVar21) ^ auVar29;
          auVar21 = packssdw(auVar29,auVar29);
          if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            pUVar2[uVar9 + 7] = 0x400;
          }
          uVar9 = uVar9 + 8;
          lVar17 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 8;
          auVar16._8_8_ = lVar17 + 8;
          lVar17 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 8;
          auVar18._8_8_ = lVar17 + 8;
          lVar17 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 8;
          auVar19._8_8_ = lVar17 + 8;
          lVar17 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 8;
          auVar20._8_8_ = lVar17 + 8;
        } while (((ulong)(uVar6 + 0x700) | 0x38) != uVar9);
        p->reps[3] = 1;
        p->state = 0;
        p->reps[0] = 1;
        p->reps[1] = 1;
        p->reps[2] = 1;
        p->needInitState = 0;
      }
      uVar6 = p->tempBufSize;
      uVar9 = (ulong)uVar6;
      if (uVar9 == 0) {
        if (inSize < 0x14 || dicLimit <= uVar11) {
          EVar7 = LzmaDec_TryDummy(p,src,inSize);
          if (EVar7 == DUMMY_ERROR) {
            memcpy(buf,src,inSize);
            p->tempBufSize = (uint)inSize;
            *srcLen = *srcLen + inSize;
            goto LAB_001961d9;
          }
          pBVar10 = src;
          if ((dicLimit <= uVar11) && (EVar7 != DUMMY_MATCH)) goto LAB_0019618b;
        }
        else {
          pBVar10 = src + (inSize - 0x14);
        }
        p->buf = src;
        iVar35 = LzmaDec_DecodeReal2(p,dicLimit,pBVar10);
        if (iVar35 != 0) {
          return 1;
        }
        uVar11 = (long)p->buf - (long)src;
        *srcLen = *srcLen + uVar11;
      }
      else {
        iVar35 = 0;
        bVar13 = uVar6 < 0x14;
        if (bVar13) {
          uVar12 = 0;
          if (inSize != 0) {
            uVar12 = 0;
            do {
              pBVar10 = src + uVar12;
              uVar12 = uVar12 + 1;
              buf[uVar9] = *pBVar10;
              bVar13 = uVar9 < 0x13;
              if (!bVar13) break;
              uVar9 = uVar9 + 1;
            } while (uVar12 < inSize);
            iVar35 = (int)uVar12;
            uVar9 = (ulong)(uVar6 + iVar35);
          }
        }
        else {
          uVar12 = 0;
        }
        p->tempBufSize = (uint)uVar9;
        if (!(bool)(uVar11 < dicLimit & (bVar13 ^ 1U))) {
          EVar7 = LzmaDec_TryDummy(p,buf,uVar9);
          if (EVar7 == DUMMY_ERROR) {
            *srcLen = *srcLen + uVar12;
LAB_001961d9:
            *status = LZMA_STATUS_NEEDS_MORE_INPUT;
            return 0;
          }
          if ((dicLimit <= uVar11) && (EVar7 != DUMMY_MATCH)) {
LAB_0019618b:
            *status = LZMA_STATUS_NOT_FINISHED;
            return 1;
          }
        }
        p->buf = buf;
        iVar8 = LzmaDec_DecodeReal2(p,dicLimit,buf);
        if (iVar8 != 0) {
          return 1;
        }
        uVar11 = (ulong)((iVar35 - (uint)uVar9) + (*(int *)&p->buf - (int)buf));
        *srcLen = *srcLen + uVar11;
        p->tempBufSize = 0;
      }
      src = src + uVar11;
      inSize = inSize - uVar11;
    } while (p->remainLen != 0x112);
  }
  uVar6 = 1;
  if (p->code == 0) {
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
    uVar6 = (uint)(p->code != 0);
  }
  return uVar6;
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}